

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonwriter.cpp
# Opt level: O0

void __thiscall CJsonWriter::WriteIndent(CJsonWriter *this,bool EndElement)

{
  byte bVar1;
  CState *pCVar2;
  byte in_SIL;
  CJsonWriter *in_RDI;
  int i;
  bool NotRootOrAttribute;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 uVar3;
  undefined4 in_stack_fffffffffffffff0;
  int iVar4;
  undefined2 in_stack_fffffffffffffff4;
  byte bVar5;
  
  bVar1 = in_SIL & 1;
  uVar3 = false;
  if (in_RDI->m_NumStates != 0) {
    pCVar2 = TopState(in_RDI);
    uVar3 = pCVar2->m_Kind != '\x03';
  }
  bVar5 = uVar3;
  if ((((bool)uVar3 != false) && (pCVar2 = TopState(in_RDI), (pCVar2->m_Empty & 1U) == 0)) &&
     ((bVar1 & 1) == 0)) {
    WriteInternal((CJsonWriter *)
                  CONCAT17(bVar1,CONCAT16(bVar5,CONCAT24(in_stack_fffffffffffffff4,
                                                         in_stack_fffffffffffffff0))),
                  (char *)CONCAT17(uVar3,in_stack_ffffffffffffffe8));
  }
  if (((bVar5 & 1) != 0) || ((bVar1 & 1) != 0)) {
    io_write_newline((IOHANDLE)0x14dd37);
  }
  if ((bVar5 & 1) != 0) {
    for (iVar4 = 0; iVar4 < in_RDI->m_Indentation; iVar4 = iVar4 + 1) {
      WriteInternal((CJsonWriter *)
                    CONCAT17(bVar1,CONCAT16(bVar5,CONCAT24(in_stack_fffffffffffffff4,iVar4))),
                    (char *)CONCAT17(uVar3,in_stack_ffffffffffffffe8));
    }
  }
  return;
}

Assistant:

void CJsonWriter::WriteIndent(bool EndElement)
{
	const bool NotRootOrAttribute = m_NumStates != 0
		&& TopState()->m_Kind != STATE_ATTRIBUTE;

	if(NotRootOrAttribute && !TopState()->m_Empty && !EndElement)
		WriteInternal(",");

	if(NotRootOrAttribute || EndElement)
		io_write_newline(m_IO);

	if(NotRootOrAttribute)
		for(int i = 0; i < m_Indentation; i++)
			WriteInternal("\t");
}